

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

Pos estimateSpawn(Generator *g,uint64_t *rng)

{
  uint64_t *in_RSI;
  int *in_RDI;
  uint64_t s;
  uint64_t spawn_biomes;
  int in_stack_00000038;
  int found;
  Pos spawn;
  uint64_t in_stack_00000060;
  uint64_t *in_stack_00000068;
  int *in_stack_00000070;
  Generator *in_stack_ffffffffffffffa8;
  uint64_t local_30 [2];
  int local_1c;
  uint64_t *local_18;
  int *local_10;
  Pos local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_8,0,8);
  if (1 < *local_10) {
    if (*local_10 < 0x16) {
      local_30[1] = 0x6c0032;
      if (*local_10 < 4) {
        local_30[1] = 0x70;
      }
      setSeed(local_30,*(uint64_t *)(local_10 + 4));
      local_8 = locateBiome(g,rng._4_4_,(int)rng,found,in_stack_00000038,spawn_biomes,
                            in_stack_00000060,in_stack_00000068,in_stack_00000070);
      if (local_1c == 0) {
        local_8.x = 8;
        local_8.z = 8;
      }
      if (local_18 != (uint64_t *)0x0) {
        *local_18 = local_30[0];
      }
    }
    else {
      local_8 = findFittestPos(in_stack_ffffffffffffffa8);
    }
  }
  return local_8;
}

Assistant:

Pos estimateSpawn(const Generator *g, uint64_t *rng)
{
    Pos spawn = {0, 0};

    if (g->mc <= MC_B1_7)
    {
        // finds a random sandblock (location is not fixed)
        return spawn;
    }
    else if (g->mc <= MC_1_17)
    {
        int found;
        uint64_t spawn_biomes = g_spawn_biomes_17;
        if (g->mc <= MC_1_0)
            spawn_biomes = (1ULL << forest) | (1ULL << swamp) |(1ULL << taiga);
        uint64_t s;
        setSeed(&s, g->seed);
        spawn = locateBiome(g, 0, 63, 0, 256, spawn_biomes, 0, &s, &found);
        if (!found)
            spawn.x = spawn.z = 8;
        if (rng)
            *rng = s;
    }
    else
    {
        spawn = findFittestPos(g);
    }

    return spawn;
}